

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int UTF8ToUTF16BE(uchar *out,int *outlen,uchar *in,int *inlen,void *vctxt)

{
  byte bVar2;
  uint uVar1;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  int iVar6;
  byte *pbVar7;
  byte *pbVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  iVar6 = (int)in;
  if (inlen == (int *)0x0 || (outlen == (int *)0x0 || out == (uchar *)0x0)) {
    iVar3 = -1;
  }
  else {
    if (in == (uchar *)0x0) {
      *outlen = 0;
      iVar6 = 0;
      iVar3 = 0;
    }
    else {
      pbVar7 = in + *inlen;
      pbVar8 = out + ((long)*outlen & 0xfffffffffffffffe);
      iVar3 = -2;
      pbVar5 = out;
      while( true ) {
        if (pbVar7 <= in) break;
        bVar2 = *in;
        if ((char)bVar2 < '\0') {
          if (bVar2 < 0xe0) {
            if (bVar2 < 0xc2) goto LAB_0012dccd;
            uVar1 = bVar2 & 0x1f;
            uVar4 = 0x80;
            lVar9 = 2;
          }
          else {
            lVar9 = 4 - (ulong)(bVar2 < 0xf0);
            uVar4 = 0x10000;
            if (bVar2 < 0xf0) {
              uVar4 = 0x800;
            }
            uVar1 = bVar2 & 0xf;
          }
          if ((long)pbVar7 - (long)in < lVar9) break;
          for (lVar10 = 1; lVar9 != lVar10; lVar10 = lVar10 + 1) {
            if ((in[lVar10] & 0xc0) != 0x80) goto LAB_0012dccd;
            uVar1 = uVar1 << 6 | in[lVar10] & 0x3f;
          }
          if (((uVar1 < uVar4) || (0x10ffff < uVar1)) || ((uVar1 & 0xfffff800) == 0xd800))
          goto LAB_0012dccd;
          bVar2 = (byte)(uVar1 >> 8);
          if (0xffff < uVar1) {
            if (3 < (long)pbVar8 - (long)pbVar5) {
              *pbVar5 = (byte)(uVar1 - 0x10000 >> 0x12) | 0xd8;
              pbVar5[1] = (byte)(uVar1 - 0x10000 >> 10);
              pbVar5[2] = bVar2 & 3 | 0xdc;
              lVar11 = 3;
              lVar10 = 4;
              goto LAB_0012dca8;
            }
            goto LAB_0012dcc8;
          }
          if (pbVar8 <= pbVar5) goto LAB_0012dcc8;
          *pbVar5 = bVar2;
          lVar11 = 1;
          lVar10 = 2;
LAB_0012dca8:
          pbVar5[lVar11] = (byte)uVar1;
          pbVar5 = pbVar5 + lVar10;
          in = in + lVar9;
        }
        else {
          if (pbVar8 <= pbVar5) {
LAB_0012dcc8:
            iVar3 = -3;
            goto LAB_0012dccd;
          }
          *pbVar5 = 0;
          pbVar5[1] = bVar2;
          in = in + 1;
          pbVar5 = pbVar5 + 2;
        }
      }
      iVar3 = (int)pbVar5 - (int)out;
LAB_0012dccd:
      *outlen = (int)pbVar5 - (int)out;
      iVar6 = (int)in - iVar6;
    }
    *inlen = iVar6;
  }
  return iVar3;
}

Assistant:

static int
UTF8ToUTF16BE(unsigned char *out, int *outlen,
              const unsigned char *in, int *inlen,
              void *vctxt ATTRIBUTE_UNUSED) {
    const unsigned char *instart = in;
    const unsigned char *inend;
    unsigned char *outstart = out;
    unsigned char *outend;
    unsigned c, d;
    int ret = XML_ENC_ERR_SPACE;

    /* UTF-16BE has no BOM */
    if ((out == NULL) || (outlen == NULL) || (inlen == NULL)) return(-1);
    if (in == NULL) {
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    inend = in + *inlen;
    outend = out + (*outlen & ~1);
    while (in < inend) {
        c = in[0];

        if (c < 0x80) {
            if (out >= outend)
                goto done;
            out[0] = 0;
            out[1] = c;
            in += 1;
            out += 2;
        } else {
            int i, len;
            unsigned min;

            if (c < 0xE0) {
                if (c < 0xC2) {
                    ret = XML_ENC_ERR_INPUT;
                    goto done;
                }
                c &= 0x1F;
                len = 2;
                min = 0x80;
            } else if (c < 0xF0) {
                c &= 0x0F;
                len = 3;
                min = 0x800;
            } else {
                c &= 0x0F;
                len = 4;
                min = 0x10000;
            }

            if (inend - in < len)
                break;

            for (i = 1; i < len; i++) {
                if ((in[i] & 0xC0) != 0x80) {
                    ret = XML_ENC_ERR_INPUT;
                    goto done;
                }
                c = (c << 6) | (in[i] & 0x3F);
            }

            if ((c < min) ||
                ((c >= 0xD800) && (c <= 0xDFFF)) ||
                (c > 0x10FFFF)) {
                ret = XML_ENC_ERR_INPUT;
                goto done;
            }

            if (c < 0x10000) {
                if (out >= outend)
                    goto done;
                out[0] = c >> 8;
                out[1] = c & 0xFF;
                out += 2;
            } else {
                if (outend - out < 4)
                    goto done;
                c -= 0x10000;
                d = (c & 0x03FF) | 0xDC00;
                c = (c >> 10)    | 0xD800;
                out[0] = c >> 8;
                out[1] = c & 0xFF;
                out[2] = d >> 8;
                out[3] = d & 0xFF;
                out += 4;
            }

            in += len;
        }
    }

    ret = out - outstart;

done:
    *outlen = out - outstart;
    *inlen = in - instart;
    return(ret);
}